

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmdOpts.cpp
# Opt level: O2

int __thiscall CmdOpts::find(CmdOpts *this,char letter)

{
  ulong uVar1;
  ulong uVar2;
  Option *pOVar3;
  
  pOVar3 = this->_opts;
  uVar2 = 0;
  uVar1 = (ulong)(uint)this->_numOpts;
  if (this->_numOpts < 1) {
    uVar1 = uVar2;
  }
  do {
    if (uVar1 == uVar2) {
LAB_0010ddd1:
      return (int)uVar1;
    }
    if (pOVar3->letter == letter) {
      uVar1 = uVar2 & 0xffffffff;
      goto LAB_0010ddd1;
    }
    uVar2 = uVar2 + 1;
    pOVar3 = pOVar3 + 1;
  } while( true );
}

Assistant:

int
CmdOpts::find(char letter)
{
    int optIdx;

    for (optIdx = 0; optIdx < _numOpts; optIdx++)
        if (_opts[optIdx].letter == letter)
            break;

    return optIdx;
}